

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O3

void __thiscall foxxll::linuxaio_queue::~linuxaio_queue(linuxaio_queue *this)

{
  (this->super_request_queue_impl_worker).super_request_queue._vptr_request_queue =
       (_func_int **)&PTR_add_request_00167ee8;
  request_queue_impl_worker::stop_thread
            (&this->super_request_queue_impl_worker,&this->post_thread_,&this->post_thread_state_,
             &this->num_waiting_requests_);
  request_queue_impl_worker::stop_thread
            (&this->super_request_queue_impl_worker,&this->wait_thread_,&this->wait_thread_state_,
             &this->num_posted_requests_);
  syscall(0xcf,this->context_);
  std::condition_variable::~condition_variable(&(this->wait_thread_state_).cv_);
  std::condition_variable::~condition_variable(&(this->post_thread_state_).cv_);
  if (((this->wait_thread_)._M_id._M_thread == 0) && ((this->post_thread_)._M_id._M_thread == 0)) {
    std::condition_variable::~condition_variable(&(this->num_posted_requests_).cv_);
    std::condition_variable::~condition_variable(&(this->num_free_events_).cv_);
    std::condition_variable::~condition_variable(&(this->num_waiting_requests_).cv_);
    std::__cxx11::
    _List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
    ::_M_clear(&(this->waiting_requests_).
                super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
              );
    return;
  }
  std::terminate();
}

Assistant:

linuxaio_queue::~linuxaio_queue()
{
    stop_thread(post_thread_, post_thread_state_, num_waiting_requests_);
    stop_thread(wait_thread_, wait_thread_state_, num_posted_requests_);
    syscall(SYS_io_destroy, context_);
}